

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Deserializer.hpp
# Opt level: O1

void_t<typename_unique_ptr<unique_ptr<int>_>::element_type>
mserialize::detail::
BuiltinDeserializer<std::unique_ptr<std::unique_ptr<int,std::default_delete<int>>,std::default_delete<std::unique_ptr<int,std::default_delete<int>>>>,void>
::
make_nonempty<std::unique_ptr<std::unique_ptr<int,std::default_delete<int>>,std::default_delete<std::unique_ptr<int,std::default_delete<int>>>>>
          (unique_ptr<std::unique_ptr<int,_std::default_delete<int>_>,_std::default_delete<std::unique_ptr<int,_std::default_delete<int>_>_>_>
           *ptr)

{
  unique_ptr<int,_std::default_delete<int>_> *__ptr;
  unique_ptr<int,_std::default_delete<int>_> *puVar1;
  
  puVar1 = (unique_ptr<int,_std::default_delete<int>_> *)operator_new(8);
  (puVar1->_M_t).super___uniq_ptr_impl<int,_std::default_delete<int>_> =
       (__uniq_ptr_impl<int,_std::default_delete<int>_>)0x0;
  __ptr = (ptr->_M_t).
          super___uniq_ptr_impl<std::unique_ptr<int,_std::default_delete<int>_>,_std::default_delete<std::unique_ptr<int,_std::default_delete<int>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::unique_ptr<int,_std::default_delete<int>_>_*,_std::default_delete<std::unique_ptr<int,_std::default_delete<int>_>_>_>
          .super__Head_base<0UL,_std::unique_ptr<int,_std::default_delete<int>_>_*,_false>.
          _M_head_impl;
  (ptr->_M_t).
  super___uniq_ptr_impl<std::unique_ptr<int,_std::default_delete<int>_>,_std::default_delete<std::unique_ptr<int,_std::default_delete<int>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::unique_ptr<int,_std::default_delete<int>_>_*,_std::default_delete<std::unique_ptr<int,_std::default_delete<int>_>_>_>
  .super__Head_base<0UL,_std::unique_ptr<int,_std::default_delete<int>_>_*,_false>._M_head_impl =
       puVar1;
  if (__ptr != (unique_ptr<int,_std::default_delete<int>_> *)0x0) {
    std::default_delete<std::unique_ptr<int,_std::default_delete<int>_>_>::operator()
              ((default_delete<std::unique_ptr<int,_std::default_delete<int>_>_> *)ptr,__ptr);
    return;
  }
  return;
}

Assistant:

static void_t<typename SmartPtr::element_type> make_nonempty(SmartPtr& ptr)
  {
    using T = typename SmartPtr::element_type;
    ptr.reset(new T{}); // NOLINT(cppcoreguidelines-owning-memory)
  }